

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void flatview_simplify(FlatView *view)

{
  undefined1 b [16];
  uint uVar1;
  undefined1 in_stack_ffffffffffffffc8 [15];
  _Bool _Var2;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  FlatView *view_local;
  
  local_14 = 0;
  while (uVar1 = local_14, local_14 < view->nr) {
    while( true ) {
      local_18 = uVar1 + 1;
      _Var2 = false;
      if (local_18 < view->nr) {
        _Var2 = can_merge(view->ranges + uVar1,view->ranges + local_18);
      }
      if (_Var2 == false) break;
      b[0xf] = _Var2;
      b._0_15_ = in_stack_ffffffffffffffc8;
      int128_addto(&view->ranges[local_14].addr.size,(Int128)b);
      uVar1 = local_18;
    }
    local_14 = local_14 + 1;
    memmove(view->ranges + local_14,view->ranges + local_18,(ulong)(view->nr - local_18) << 6);
    view->nr = view->nr - (local_18 - local_14);
  }
  return;
}

Assistant:

static void flatview_simplify(FlatView *view)
{
    unsigned i, j;

    i = 0;
    while (i < view->nr) {
        j = i + 1;
        while (j < view->nr
               && can_merge(&view->ranges[j-1], &view->ranges[j])) {
            int128_addto(&view->ranges[i].addr.size, view->ranges[j].addr.size);
            ++j;
        }
        ++i;
        memmove(&view->ranges[i], &view->ranges[j],
                (view->nr - j) * sizeof(view->ranges[j]));
        view->nr -= j - i;
    }
}